

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O0

void duckdb::TemplatedFillLoop<float>
               (Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  float fVar1;
  VectorType VVar2;
  bool bVar3;
  float *count_00;
  UnifiedVectorFormat *format;
  idx_t iVar4;
  float *pfVar5;
  uint in_ECX;
  SelectionVector *in_RDX;
  Vector *in_RDI;
  idx_t res_idx;
  idx_t source_idx;
  idx_t i_2;
  float *data_1;
  UnifiedVectorFormat vdata;
  idx_t i_1;
  idx_t i;
  float *data;
  ValidityMask *result_mask;
  float *res;
  idx_t in_stack_ffffffffffffff08;
  UnifiedVectorFormat *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  UnifiedVectorFormat *this;
  undefined8 in_stack_ffffffffffffff38;
  Vector *in_stack_ffffffffffffff40;
  ulong local_b0;
  UnifiedVectorFormat local_90;
  ulong local_48;
  ulong local_40;
  float *local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  Vector::SetVectorType
            (in_stack_ffffffffffffff40,(VectorType)((ulong)in_stack_ffffffffffffff38 >> 0x38));
  count_00 = FlatVector::GetData<float>((Vector *)0x638db2);
  format = (UnifiedVectorFormat *)FlatVector::Validity((Vector *)0x638dc7);
  VVar2 = Vector::GetVectorType(in_RDI);
  if (VVar2 == CONSTANT_VECTOR) {
    local_38 = ConstantVector::GetData<float>((Vector *)0x638df1);
    bVar3 = ConstantVector::IsNull((Vector *)0x638e06);
    if (bVar3) {
      for (local_40 = 0; local_40 < in_ECX; local_40 = local_40 + 1) {
        SelectionVector::get_index(in_RDX,local_40);
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      }
    }
    else {
      for (local_48 = 0; local_48 < in_ECX; local_48 = local_48 + 1) {
        fVar1 = *local_38;
        pfVar5 = count_00;
        iVar4 = SelectionVector::get_index(in_RDX,local_48);
        count_00[iVar4] = fVar1;
        count_00 = pfVar5;
      }
    }
  }
  else {
    this = &local_90;
    UnifiedVectorFormat::UnifiedVectorFormat(this);
    Vector::ToUnifiedFormat
              ((Vector *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(idx_t)count_00,format);
    pfVar5 = UnifiedVectorFormat::GetData<float>(&local_90);
    for (local_b0 = 0; local_b0 < in_ECX; local_b0 = local_b0 + 1) {
      iVar4 = SelectionVector::get_index(local_90.sel,local_b0);
      in_stack_ffffffffffffff10 = (UnifiedVectorFormat *)SelectionVector::get_index(in_RDX,local_b0)
      ;
      count_00[(long)in_stack_ffffffffffffff10] = pfVar5[iVar4];
      in_stack_ffffffffffffff1f =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                      (idx_t)in_stack_ffffffffffffff10);
      TemplatedValidityMask<unsigned_long>::Set
                ((TemplatedValidityMask<unsigned_long> *)this,
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                 SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}